

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Region.cpp
# Opt level: O2

vector<remote::Region,_std::allocator<remote::Region>_> *
remote::GetRegions(vector<remote::Region,_std::allocator<remote::Region>_> *__return_storage_ptr__,
                  pid_t pid)

{
  int iVar1;
  ostream *poVar2;
  istream *piVar3;
  long lVar4;
  long lVar5;
  char cVar6;
  string *this;
  string content;
  Region r;
  string str;
  string local_588 [32];
  string line;
  stringstream ss;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_538;
  uint auStack_520 [88];
  stringstream path;
  ostream local_3b0 [376];
  ifstream m;
  
  (__return_storage_ptr__->super__Vector_base<remote::Region,_std::allocator<remote::Region>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<remote::Region,_std::allocator<remote::Region>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<remote::Region,_std::allocator<remote::Region>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::stringstream::stringstream((stringstream *)&path);
  poVar2 = std::operator<<(local_3b0,"/proc/");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,pid);
  std::operator<<(poVar2,"/maps");
  std::__cxx11::stringbuf::str();
  std::ifstream::ifstream(&m,_ss,_S_in);
  std::__cxx11::string::~string((string *)&ss);
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  do {
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&m,(string *)&line);
    if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) {
      std::__cxx11::string::~string((string *)&line);
      std::ifstream::~ifstream(&m);
      std::__cxx11::stringstream::~stringstream((stringstream *)&path);
      return __return_storage_ptr__;
    }
    r.pathname._M_dataplus._M_p = (pointer)&r.pathname.field_2;
    r.filename._M_dataplus._M_p = (pointer)&r.filename.field_2;
    r.pathname._M_string_length = 0;
    r.pathname.field_2._M_local_buf[0] = '\0';
    r.read = false;
    r.write = false;
    r.exec = false;
    r.shared = false;
    r.start = 0;
    r.end = 0;
    r.deviceMinor = 0;
    r.inodeFileNumber = 0;
    r.offset = 0;
    r.deviceMajor = 0;
    r.filename.field_2._M_local_buf[0] = '\0';
    r.filename._M_string_length = 0;
    std::__cxx11::string::string((string *)&str,(string *)&line);
    lVar5 = 0;
    while (str._M_string_length != 0) {
      cVar6 = (char)&str;
      lVar4 = std::__cxx11::string::find(cVar6,0x20);
      if (lVar4 == -1) {
        if (str._M_string_length != 0) {
          std::__cxx11::string::_M_assign((string *)&r.pathname);
          if (*str._M_dataplus._M_p == '/') {
            std::__cxx11::string::rfind(cVar6,0x2f);
            std::__cxx11::string::substr((ulong)&ss,(ulong)&str);
            std::__cxx11::string::operator=((string *)&r.filename,(string *)&ss);
            this = (string *)&ss;
            goto LAB_00105aaa;
          }
          std::__cxx11::string::_M_assign((string *)&r.filename);
        }
        break;
      }
      std::__cxx11::string::substr((ulong)&content,(ulong)&str);
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      iVar1 = (int)(string *)&ss;
      switch(lVar5) {
      case 0:
        lVar4 = std::__cxx11::string::find((char)&content,0x2d);
        if (lVar4 != -1) {
          *(uint *)((long)auStack_520 + *(long *)(local_538._M_allocated_capacity - 0x18)) =
               *(uint *)((long)auStack_520 + *(long *)(local_538._M_allocated_capacity - 0x18)) &
               0xffffffb5 | 8;
          std::__cxx11::string::substr((ulong)local_588,(ulong)&content);
          std::operator<<((ostream *)local_538._M_local_buf,local_588);
          std::__cxx11::string::~string(local_588);
          std::istream::_M_extract<unsigned_long>((ulong *)&ss);
          std::ios::clear((int)*(undefined8 *)(_ss + -0x18) + iVar1);
          *(uint *)((long)auStack_520 + *(long *)(local_538._M_allocated_capacity - 0x18)) =
               *(uint *)((long)auStack_520 + *(long *)(local_538._M_allocated_capacity - 0x18)) &
               0xffffffb5 | 8;
          std::__cxx11::string::substr((ulong)local_588,(ulong)&content);
          std::operator<<((ostream *)local_538._M_local_buf,local_588);
          std::__cxx11::string::~string(local_588);
          std::istream::_M_extract<unsigned_long>((ulong *)&ss);
          std::ios::clear((int)*(undefined8 *)(_ss + -0x18) + iVar1);
        }
        break;
      case 1:
        r.write = content._M_dataplus._M_p[1] == 'w';
        r.read = *content._M_dataplus._M_p == 'r';
        r.exec = content._M_dataplus._M_p[2] == 'x';
        r.shared = content._M_dataplus._M_p[3] == 'p';
        break;
      case 2:
        *(uint *)((long)auStack_520 + *(long *)(local_538._M_allocated_capacity - 0x18)) =
             *(uint *)((long)auStack_520 + *(long *)(local_538._M_allocated_capacity - 0x18)) &
             0xffffffb5 | 8;
        std::operator<<((ostream *)local_538._M_local_buf,(string *)&content);
        goto LAB_00105876;
      case 3:
        lVar4 = std::__cxx11::string::find((char)&content,0x3a);
        if (lVar4 != -1) {
          *(uint *)((long)auStack_520 + *(long *)(local_538._M_allocated_capacity - 0x18)) =
               *(uint *)((long)auStack_520 + *(long *)(local_538._M_allocated_capacity - 0x18)) &
               0xffffffb5 | 2;
          std::__cxx11::string::substr((ulong)local_588,(ulong)&content);
          std::operator<<((ostream *)local_538._M_local_buf,local_588);
          std::__cxx11::string::~string(local_588);
          std::istream::_M_extract<unsigned_long>((ulong *)&ss);
          std::ios::clear((int)*(undefined8 *)(_ss + -0x18) + iVar1);
          *(uint *)((long)auStack_520 + *(long *)(local_538._M_allocated_capacity - 0x18)) =
               *(uint *)((long)auStack_520 + *(long *)(local_538._M_allocated_capacity - 0x18)) &
               0xffffffb5 | 2;
          std::__cxx11::string::substr((ulong)local_588,(ulong)&content);
          std::operator<<((ostream *)local_538._M_local_buf,local_588);
          std::__cxx11::string::~string(local_588);
          std::istream::_M_extract<unsigned_long>((ulong *)&ss);
          std::ios::clear((int)*(undefined8 *)(_ss + -0x18) + iVar1);
        }
        break;
      case 4:
        std::operator<<((ostream *)local_538._M_local_buf,(string *)&content);
LAB_00105876:
        std::istream::_M_extract<unsigned_long>((ulong *)&ss);
        std::ios::clear((int)*(undefined8 *)(_ss + -0x18) + iVar1);
      }
      std::__cxx11::string::substr((ulong)local_588,(ulong)&str);
      std::__cxx11::string::operator=((string *)&str,local_588);
      std::__cxx11::string::~string(local_588);
      lVar4 = std::__cxx11::string::find_first_not_of(cVar6,0x20);
      if (lVar4 == -1) {
        std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
        this = &content;
LAB_00105aaa:
        std::__cxx11::string::~string((string *)this);
        break;
      }
      std::__cxx11::string::substr((ulong)local_588,(ulong)&str);
      std::__cxx11::string::operator=((string *)&str,local_588);
      std::__cxx11::string::~string(local_588);
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
      std::__cxx11::string::~string((string *)&content);
      lVar5 = lVar5 + 1;
    }
    if ((r.start != 0) && (r.end != 0)) {
      std::vector<remote::Region,_std::allocator<remote::Region>_>::push_back
                (__return_storage_ptr__,&r);
    }
    std::__cxx11::string::~string((string *)&str);
    Region::~Region(&r);
  } while( true );
}

Assistant:

vector<Region> remote::GetRegions(pid_t pid) {
    vector<Region> ret;

    stringstream path;
    path << "/proc/" << pid << "/maps";

    ifstream m(path.str().c_str());

    string line;
    while(getline(m, line)) {
        Region r;

        size_t count = 0;

        string str = line;

        while(str.length()) {
            size_t nextSpace = str.find_first_of(' ');

            if(nextSpace == -1) {
                if(!str.empty()) {
                    r.pathname = str;

                    if(str.c_str()[0] == '/') {
                        r.filename = str.substr(str.find_last_of('/') + 1, str.length());
                    } else {
                        r.filename = r.pathname;
                    }
                }

                break; // Stuff
            } else {
                string content = str.substr(0, nextSpace);

                // Deal with content
                stringstream ss;

                if(count == 0) {
                    size_t spl = content.find_first_of('-');

                    if(spl != -1) {
                        ss << hex << content.substr(0, spl);
                        ss >> r.start;
                        ss.clear();
                        ss << hex << content.substr(spl + 1, content.size());
                        ss >> r.end;
                        ss.clear();
                    }
                } else if(count == 1) { // Permissions
                    r.read = (content.c_str()[0] == 'r');
                    r.write = (content.c_str()[1] == 'w');
                    r.exec = (content.c_str()[2] == 'x');
                    r.shared = (content.c_str()[3] == 'p');
                } else if(count == 2) { // Offset
                    ss << hex << content;
                    ss >> r.offset;
                    ss.clear();
                } else if(count == 3) { // Device Info
                    size_t spl = content.find_first_of(':');

                    if(spl != -1) {
                        ss << dec << content.substr(0, spl);
                        ss >> r.deviceMajor;
                        ss.clear();
                        ss << dec << content.substr(spl + 1, content.size());
                        ss >> r.deviceMinor;
                        ss.clear();
                    }
                } else if(count == 4) { // INode shit
                    ss << content;
                    ss >> r.inodeFileNumber;
                    ss.clear();
                }

                count++;

                // Advance
                str = str.substr(nextSpace);

                size_t firstNonSpace = str.find_first_not_of(' ');

                if(firstNonSpace == -1) {
                    break;
                }

                str = str.substr(firstNonSpace);
            }
        }

        if(r.start != 0 && r.end != 0) {
            ret.push_back(r);
        }
    }

    return ret;
}